

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O1

int dotakeoff(obj *otmp)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  
  if (otmp == (obj *)0x0) {
    otmp = getobj("\x03\x04\x05\x06\a","take off",(obj **)0x0);
  }
  else {
    bVar1 = validate_object(otmp,"\x03","take off");
    if (bVar1 == '\0') {
      return 0;
    }
  }
  if (otmp == (obj *)0x0) {
    return 0;
  }
  if (otmp->oclass != '\x03') {
    iVar2 = doremring(otmp);
    return iVar2;
  }
  if ((otmp->owornmask & 0x7f) == 0) {
    pcVar3 = "You are not wearing that.";
  }
  else {
    if (otmp == uskin) {
      pcVar3 = "dragon scale mail is";
      if ((ushort)(uskin->otyp - 0x5fU) < 0xb) {
        pcVar3 = "dragon scales are";
      }
      pline("The %s merged with your skin!",pcVar3);
      return 0;
    }
    if (otmp != uarm || uarmc == (obj *)0x0) {
      if ((otmp != uarmu) || (uarm == (obj *)0x0 && uarmc == (obj *)0x0)) {
        takeoff_mask = 0;
        taking_off = 0;
        disrobing = (char *)0x0;
        select_off(otmp);
        if (takeoff_mask != 0) {
          takeoff_mask = 0;
          taking_off = 0;
          disrobing = (char *)0x0;
          armoroff(otmp);
          return 1;
        }
        return 0;
      }
    }
    pcVar3 = "The rest of your armor is in the way.";
  }
  pline(pcVar3);
  return 0;
}

Assistant:

int dotakeoff(struct obj *otmp)
{
	if (otmp && !validate_object(otmp, clothes, "take off"))
		return 0;
	else if (!otmp)
		otmp = getobj(clothes_and_accessories, "take off", NULL);
	if (!otmp) return 0;
        if (otmp->oclass != ARMOR_CLASS) return doremring(otmp);
	if (!(otmp->owornmask & W_ARMOR)) {
		pline("You are not wearing that.");
		return 0;
	}
	if (otmp == uskin) {
	        pline("The %s merged with your skin!",
		      Is_dragon_scales(uskin->otyp) ?
		      "dragon scales are" : "dragon scale mail is");
		return 0;
	}
	if (((otmp == uarm) && uarmc) ||
            ((otmp == uarmu) && (uarmc || uarm))) {
            /* TODO: replace this with a multistep remove */
	    pline("The rest of your armor is in the way.");
	    return 0;
	}

	reset_remarm();		/* clear takeoff_mask and taking_off */
	select_off(otmp);
	if (!takeoff_mask) return 0;
	reset_remarm();		/* armoroff() doesn't use takeoff_mask */

	armoroff(otmp);
	return 1;
}